

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sh.cpp
# Opt level: O1

bool __thiscall CmdSh::Execute(CmdSh *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  char cVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  string s;
  CommandSptr cmd;
  value_type fileName;
  ifstream fin;
  undefined1 *local_2a8;
  long local_2a0;
  undefined1 local_298 [16];
  undefined8 *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  char *local_278;
  long local_270;
  char local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  long local_238 [4];
  byte abStack_218 [488];
  
  if ((this->super_Command).option.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size == 0) {
    p_Var1 = (this->super_Command).parameter.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    local_278 = local_268;
    p_Var2 = p_Var1[1]._M_next;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,p_Var2,(long)&(p_Var1[1]._M_prev)->_M_next + (long)p_Var2);
    std::ifstream::ifstream((istream *)local_238,(string *)&local_278,_S_in);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"sh: cannot stat \'",0x11);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_278,local_270);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\': No such fileName or directory",0x20);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else {
      do {
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) break;
        local_2a0 = 0;
        local_298[0] = 0;
        local_2a8 = local_298;
        cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_2a8,cVar4);
        iVar5 = std::__cxx11::string::compare((char *)&local_2a8);
        if (iVar5 != 0) {
          local_258[0] = local_248;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_258,local_2a8,local_2a8 + local_2a0);
          CmdParser::Parse((CmdParser *)&local_288,(string *)&this->field_0x38);
          if (local_258[0] != local_248) {
            operator_delete(local_258[0]);
          }
          if (local_288 != (undefined8 *)0x0) {
            (**(code **)*local_288)();
          }
          if (local_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280);
          }
        }
        if (local_2a8 != local_298) {
          operator_delete(local_2a8);
        }
      } while (iVar5 != 0);
    }
    std::ifstream::~ifstream(local_238);
    if (local_278 != local_268) {
      operator_delete(local_278);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"sh: invalid option",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    cVar3 = '\0';
  }
  return (bool)cVar3;
}

Assistant:

bool CmdSh::Execute(){
	if(option.size() != 0){
		cout << "sh: invalid option" << endl;
		return false;
	}
	
	auto fileName = parameter.front();
	ifstream fin(fileName);
	if(!fin.is_open()){
		cout << "sh: cannot stat '" << fileName << "': No such fileName or directory" << endl;
		return false;
	}

	while(!fin.eof()){
		string s;
		getline(fin, s);
		if(s == "exit")break;
		auto cmd = cmdPsr.Parse(s);
		if(cmd != nullptr)cmd->Execute();
	}

	return true;
}